

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O0

void __thiscall
llm_graph_input_attn_cross::set_input(llm_graph_input_attn_cross *this,llama_ubatch *ubatch)

{
  bool bVar1;
  ulong uVar2;
  byte *in_RSI;
  long in_RDI;
  int j_1;
  int i_1;
  llama_seq_id seq_id;
  int s;
  float f;
  int i;
  int j;
  int h;
  float *data;
  int64_t n_tokens;
  int64_t n_enc;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_ffffffffffffff98;
  int local_58;
  int local_54;
  _Self local_50;
  _Self local_48;
  undefined4 local_40;
  int local_3c;
  undefined4 local_38;
  int local_34;
  int local_30;
  int local_2c;
  long local_28;
  ulong local_20;
  long local_18;
  byte *local_10;
  
  if (*(long *)(in_RDI + 8) != 0) {
    local_18 = *(long *)(*(long *)(in_RDI + 8) + 0x10);
    local_20 = (ulong)*(uint *)(in_RSI + 4);
    local_10 = in_RSI;
    uVar2 = ggml_backend_buffer_is_host(*(undefined8 *)(*(long *)(in_RDI + 8) + 8));
    if ((uVar2 & 1) == 0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-graph.cpp"
                 ,0x209,"GGML_ASSERT(%s) failed",
                 "ggml_backend_buffer_is_host(cross_kq_mask->buffer)");
    }
    if ((*local_10 & 1) != 0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-graph.cpp"
                 ,0x20a,"GGML_ASSERT(%s) failed","!ubatch->equal_seqs");
    }
    local_28 = *(long *)(*(long *)(in_RDI + 8) + 0xf8);
    for (local_2c = 0; local_2c < 1; local_2c = local_2c + 1) {
      for (local_30 = 0; (long)local_30 < (long)local_20; local_30 = local_30 + 1) {
        for (local_34 = 0; local_34 < local_18; local_34 = local_34 + 1) {
          local_38 = 0xff800000;
          for (local_3c = 0; local_3c < *(int *)(*(long *)(local_10 + 0x28) + (long)local_30 * 4);
              local_3c = local_3c + 1) {
            local_40 = *(undefined4 *)
                        (*(long *)(*(long *)(local_10 + 0x30) + (long)local_30 * 8) +
                        (long)local_3c * 4);
            std::
            vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
            ::operator[]((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                          *)(*(long *)(in_RDI + 0x18) + 0x28),(long)local_34);
            local_48._M_node =
                 (_Base_ptr)
                 std::set<int,_std::less<int>,_std::allocator<int>_>::find
                           (in_stack_ffffffffffffff98,(key_type *)0x43277a);
            std::
            vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
            ::operator[]((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                          *)(*(long *)(in_RDI + 0x18) + 0x28),(long)local_34);
            local_50._M_node =
                 (_Base_ptr)
                 std::set<int,_std::less<int>,_std::allocator<int>_>::end(in_stack_ffffffffffffff98)
            ;
            bVar1 = std::operator!=(&local_48,&local_50);
            if (bVar1) {
              local_38 = 0;
            }
          }
          *(undefined4 *)
           (local_28 +
           ((long)local_2c * local_18 * local_20 + local_30 * local_18 + (long)local_34) * 4) =
               local_38;
        }
      }
      for (local_54 = (int)local_20; (long)local_54 < (long)(local_20 + 0x3f & 0xffffffffffffffc0);
          local_54 = local_54 + 1) {
        for (local_58 = 0; local_58 < local_18; local_58 = local_58 + 1) {
          *(undefined4 *)
           (local_28 +
           ((long)local_2c * local_18 * local_20 + local_54 * local_18 + (long)local_58) * 4) =
               0xff800000;
        }
      }
    }
  }
  return;
}

Assistant:

void llm_graph_input_attn_cross::set_input(const llama_ubatch * ubatch) {
    if (cross_kq_mask) {
        const int64_t n_enc    = cross_kq_mask->ne[0];
        const int64_t n_tokens = ubatch->n_tokens;

        GGML_ASSERT(ggml_backend_buffer_is_host(cross_kq_mask->buffer));
        GGML_ASSERT(!ubatch->equal_seqs); // TODO: use ubatch->n_seqs instead of failing

        float * data = (float *) cross_kq_mask->data;

        for (int h = 0; h < 1; ++h) {
            for (int j = 0; j < n_tokens; ++j) {
                for (int i = 0; i < n_enc; ++i) {
                    float f = -INFINITY;
                    for (int s = 0; s < ubatch->n_seq_id[j]; ++s) {
                        const llama_seq_id seq_id = ubatch->seq_id[j][s];
                        if (cross->seq_ids_enc[i].find(seq_id) != cross->seq_ids_enc[i].end()) {
                            f = 0.0f;
                        }
                    }
                    data[h*(n_enc*n_tokens) + j*n_enc + i] = f;
                }
            }

            for (int i = n_tokens; i < GGML_PAD(n_tokens, GGML_KQ_MASK_PAD); ++i) {
                for (int j = 0; j < n_enc; ++j) {
                    data[h*(n_enc*n_tokens) + i*n_enc + j] = -INFINITY;
                }
            }
        }
    }
}